

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_classifier.h
# Opt level: O2

int Classifier_match(Classifier *me,char *suffix,exr_pixel_type_t type)

{
  int iVar1;
  bool bVar2;
  
  if (me->_type == type) {
    if (me->_caseInsensitive == 0) {
      iVar1 = strcmp(suffix,me->_suffix);
    }
    else {
      iVar1 = strcasecmp(suffix,me->_suffix);
    }
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return (int)bVar2;
}

Assistant:

static inline int
Classifier_match (
    const Classifier* me, const char* suffix, const exr_pixel_type_t type)
{
    if (me->_type != type) return DWA_CLASSIFIER_FALSE;
#ifdef _MSC_VER
    if (me->_caseInsensitive) return _stricmp (suffix, me->_suffix) == 0;
#else
    if (me->_caseInsensitive) return strcasecmp (suffix, me->_suffix) == 0;
#endif

    return strcmp (suffix, me->_suffix) == 0;
}